

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O3

Am_Object create_new_obj_internal(Am_Object *prototype,Am_Inter_Location *data)

{
  char cVar1;
  ushort uVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  ostream *poVar6;
  bool *in_RDX;
  bool create_line;
  int d;
  int c;
  int b;
  int a;
  Am_Style color;
  Am_Object ref_obj;
  Am_Object color_rect;
  undefined1 local_51 [5];
  uint local_4c;
  uint local_48;
  uint local_44;
  Am_Object local_40;
  Am_Style local_38 [8];
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  
  local_30.data = (Am_Object_Data *)0x0;
  Am_Inter_Location::Get_Location
            (in_RDX,(Am_Object *)local_51,(int *)&local_30,(int *)&local_44,(int *)&local_48,
             (int *)&local_4c);
  cVar1 = Am_Object::operator!=(&local_30,&created_objs);
  if (cVar1 != '\0') {
    Am_Translate_Coordinates
              (&local_30,local_44,local_48,&created_objs,(int *)&local_44,(int *)&local_48);
    if (local_51[0] == '\x01') {
      Am_Translate_Coordinates
                (&local_30,local_4c,local_51._1_4_,&created_objs,(int *)&local_4c,
                 (int *)(local_51 + 1));
    }
  }
  local_28.data = (Am_Object_Data *)0x0;
  pAVar3 = (Am_Value *)Am_Object::Get(0x6710,0x169);
  Am_Object::operator=(&local_28,pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_28,0x6a);
  Am_Style::Am_Style(local_38,pAVar3);
  prototype->data = (Am_Object_Data *)0x0;
  if (local_51[0] == '\x01') {
    Am_Object::Create((char *)&local_40);
    pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(local_38);
    uVar2 = Am_Object::Set((ushort)&local_40,(Am_Wrapper *)0x6b,(ulong)pAVar4);
    uVar2 = Am_Object::Set(uVar2,0x8b,(ulong)local_44);
    uVar2 = Am_Object::Set(uVar2,0x8c,(ulong)local_48);
    uVar2 = Am_Object::Set(uVar2,0x8d,(ulong)local_4c);
    pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x8e,(ulong)(uint)local_51._1_4_);
    Am_Object::operator=(prototype,pAVar5);
    Am_Object::~Am_Object(&local_40);
    Set_XY_Anims_On(prototype);
  }
  else {
    cVar1 = Am_Object::Valid();
    if (cVar1 == '\0') {
      Am_Object::operator=(prototype,(Am_Object *)&Am_No_Object);
    }
    else {
      Am_Object::Create((char *)&local_40);
      uVar2 = Am_Object::Set((ushort)&local_40,100,(ulong)local_44);
      pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x65,(ulong)local_48);
      Am_Object::operator=(prototype,pAVar5);
      Am_Object::~Am_Object(&local_40);
      cVar1 = Am_Inter_Location::Get_Growing();
      if (cVar1 != '\0') {
        uVar2 = Am_Object::Set((ushort)prototype,0x66,(ulong)local_4c);
        Am_Object::Set(uVar2,0x67,(ulong)(uint)local_51._1_4_);
      }
      cVar1 = Am_Object::operator==((Am_Object *)data,&my_text_proto);
      if (cVar1 == '\0') {
        pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(local_38);
        uVar2 = 0x6a;
      }
      else {
        pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(local_38);
        uVar2 = 0x6b;
      }
      Am_Object::Set((ushort)prototype,(Am_Wrapper *)(ulong)uVar2,(ulong)pAVar4);
    }
  }
  cVar1 = Am_Object::Valid();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n--++-- Created new object ",0x1b);
    poVar6 = (ostream *)operator<<((ostream *)&std::cout,prototype);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," at (",5);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_4c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,local_51._1_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
    std::ostream::flush();
    Am_Object::Am_Object(&local_20,prototype);
    Am_Object::Add_Part((Am_Object)0x1166a8,SUB81(&local_20,0),1);
    Am_Object::~Am_Object(&local_20);
    Am_Object::operator=(&last_created_obj,prototype);
  }
  Am_Style::~Am_Style(local_38);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  return (Am_Object)(Am_Object_Data *)prototype;
}

Assistant:

Am_Object
create_new_obj_internal(Am_Object prototype, Am_Inter_Location data)
{
  Am_Object ref_obj;
  int a, b, c, d;
  bool create_line;
  data.Get_Location(create_line, ref_obj, a, b, c, d);
  if (ref_obj != created_objs) {
    Am_Translate_Coordinates(ref_obj, a, b, created_objs, a, b);
    if (create_line)
      Am_Translate_Coordinates(ref_obj, c, d, created_objs, c, d);
  }

  Am_Object color_rect;
  color_rect = color_panel.Get(Am_VALUE);
  Am_Style color = color_rect.Get(Am_FILL_STYLE);

  Am_Object new_obj;
  if (create_line) {
    new_obj = prototype.Create()
                  .Set(Am_LINE_STYLE, color, Am_NO_ANIMATION)
                  .Set(Am_X1, a, Am_NO_ANIMATION)
                  .Set(Am_Y1, b, Am_NO_ANIMATION)
                  .Set(Am_X2, c, Am_NO_ANIMATION)
                  .Set(Am_Y2, d, Am_NO_ANIMATION);
    Set_XY_Anims_On(new_obj);
  } else if (prototype.Valid()) {
    new_obj = prototype.Create()
                  .Set(Am_LEFT, a, Am_NO_ANIMATION)
                  .Set(Am_TOP, b, Am_NO_ANIMATION);
    if (data.Get_Growing())
      new_obj.Set(Am_WIDTH, c, Am_NO_ANIMATION)
          .Set(Am_HEIGHT, d, Am_NO_ANIMATION);
    if (prototype == my_text_proto)
      new_obj.Set(Am_LINE_STYLE, color, Am_NO_ANIMATION);
    else
      new_obj.Set(Am_FILL_STYLE, color, Am_NO_ANIMATION);
  } else
    new_obj = Am_No_Object;

  if (new_obj.Valid()) {
    std::cout << "\n--++-- Created new object " << new_obj << " at (" << a
              << "," << b << "," << c << "," << d << ")\n"
              << std::flush;
    created_objs.Add_Part(new_obj);
    last_created_obj = new_obj;
  }
  return new_obj;
}